

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::ARITH_OP(SQVM *this,SQUnsignedInteger op,SQObjectPtr *trg,SQObjectPtr *o1,SQObjectPtr *o2)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  SQObjectType SVar4;
  double dVar5;
  float local_88;
  float local_84;
  SQFloat f2;
  SQFloat f1;
  SQFloat res_1;
  SQInteger i2;
  SQInteger i1;
  SQInteger res;
  SQInteger tmask;
  SQObjectPtr *o2_local;
  SQObjectPtr *o1_local;
  SQObjectPtr *trg_local;
  SQUnsignedInteger op_local;
  SQVM *this_local;
  
  SVar4 = (o1->super_SQObject)._type | (o2->super_SQObject)._type;
  if (SVar4 == OT_INTEGER) {
    lVar1 = (o1->super_SQObject)._unVal.nInteger;
    lVar2 = (o2->super_SQObject)._unVal.nInteger;
    switch(op) {
    case 0x25:
      if (lVar2 == 0) {
        Raise_Error(this,"modulo by zero");
        return false;
      }
      if ((lVar2 == -1) && (lVar1 == -0x80000000)) {
        i1 = 0;
      }
      else {
        i1 = lVar1 % lVar2;
      }
      break;
    default:
      i1 = 0xdeadbeef;
      break;
    case 0x2a:
      i1 = lVar1 * lVar2;
      break;
    case 0x2b:
      i1 = lVar1 + lVar2;
      break;
    case 0x2d:
      i1 = lVar1 - lVar2;
      break;
    case 0x2f:
      if (lVar2 == 0) {
        Raise_Error(this,"division by zero");
        return false;
      }
      if ((lVar2 == -1) && (lVar1 == -0x80000000)) {
        Raise_Error(this,"integer overflow");
        return false;
      }
      i1 = lVar1 / lVar2;
    }
    ::SQObjectPtr::operator=(trg,i1);
  }
  else if ((SVar4 == OT_FLOAT) || (SVar4 == 0x5000006)) {
    if ((o1->super_SQObject)._type == OT_INTEGER) {
      local_84 = (float)(o1->super_SQObject)._unVal.nInteger;
    }
    else {
      local_84 = (o1->super_SQObject)._unVal.fFloat;
    }
    if ((o2->super_SQObject)._type == OT_INTEGER) {
      local_88 = (float)(o2->super_SQObject)._unVal.nInteger;
    }
    else {
      local_88 = (o2->super_SQObject)._unVal.fFloat;
    }
    switch(op) {
    case 0x25:
      dVar5 = fmod((double)local_84,(double)local_88);
      f2 = (SQFloat)dVar5;
      break;
    default:
      f2 = 15.0;
      break;
    case 0x2a:
      f2 = local_84 * local_88;
      break;
    case 0x2b:
      f2 = local_84 + local_88;
      break;
    case 0x2d:
      f2 = local_84 - local_88;
      break;
    case 0x2f:
      f2 = local_84 / local_88;
    }
    ::SQObjectPtr::operator=(trg,f2);
  }
  else if ((op == 0x2b) && ((SVar4 & 0x10) != 0)) {
    bVar3 = StringCat(this,o1,o2,trg);
    if (!bVar3) {
      return false;
    }
  }
  else {
    bVar3 = ArithMetaMethod(this,op,o1,o2,trg);
    if (!bVar3) {
      return false;
    }
  }
  return true;
}

Assistant:

bool SQVM::ARITH_OP(SQUnsignedInteger op,SQObjectPtr &trg,const SQObjectPtr &o1,const SQObjectPtr &o2)
{
    SQInteger tmask = type(o1)|type(o2);
    switch(tmask) {
        case OT_INTEGER:{
            SQInteger res, i1 = _integer(o1), i2 = _integer(o2);
            switch(op) {
            case '+': res = i1 + i2; break;
            case '-': res = i1 - i2; break;
            case '/': if (i2 == 0) { Raise_Error(_SC("division by zero")); return false; }
                    else if (i2 == -1 && i1 == INT_MIN) { Raise_Error(_SC("integer overflow")); return false; }
                    res = i1 / i2;
                    break;
            case '*': res = i1 * i2; break;
            case '%': if (i2 == 0) { Raise_Error(_SC("modulo by zero")); return false; }
                    else if (i2 == -1 && i1 == INT_MIN) { res = 0; break; }
                    res = i1 % i2;
                    break;
            default: res = 0xDEADBEEF;
            }
            trg = res; }
            break;
        case (OT_FLOAT|OT_INTEGER):
        case (OT_FLOAT):{
            SQFloat res, f1 = tofloat(o1), f2 = tofloat(o2);
            switch(op) {
            case '+': res = f1 + f2; break;
            case '-': res = f1 - f2; break;
            case '/': res = f1 / f2; break;
            case '*': res = f1 * f2; break;
            case '%': res = SQFloat(fmod((double)f1,(double)f2)); break;
            default: res = 0x0f;
            }
            trg = res; }
            break;
        default:
            if(op == '+' && (tmask & _RT_STRING)){
                if(!StringCat(o1, o2, trg)) return false;
            }
            else if(!ArithMetaMethod(op,o1,o2,trg)) {
                return false;
            }
    }
    return true;
}